

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

int32_t secp256k1_modinv32_posdivsteps_30_var
                  (int32_t eta,uint32_t f0,uint32_t g0,secp256k1_modinv32_trans2x2 *t,int *jacp)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  int *in_RCX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  uint *in_R8;
  bool bVar7;
  uint32_t tmp;
  int jac;
  int zeros;
  int limit;
  int i;
  uint16_t w;
  uint32_t m;
  uint32_t g;
  uint32_t f;
  uint32_t r;
  uint32_t q;
  uint32_t v;
  uint32_t u;
  int local_58;
  uint local_50;
  int local_44;
  uint local_38;
  uint local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_4;
  
  local_24 = 1;
  local_28 = 0;
  local_2c = 0;
  local_30 = 1;
  local_44 = 0x1e;
  local_50 = *in_R8;
  local_38 = in_EDX;
  local_34 = in_ESI;
  local_4 = in_EDI;
  while( true ) {
    uVar2 = secp256k1_ctz32_var(0);
    bVar6 = (byte)uVar2;
    uVar3 = local_38 >> (bVar6 & 0x1f);
    iVar4 = local_24 << (bVar6 & 0x1f);
    iVar5 = local_28 << (bVar6 & 0x1f);
    local_4 = local_4 - uVar2;
    local_44 = local_44 - uVar2;
    local_50 = uVar2 & (local_34 >> 1 ^ local_34 >> 2) ^ local_50;
    if (local_44 == 0) {
      *in_RCX = iVar4;
      in_RCX[1] = iVar5;
      in_RCX[2] = local_2c;
      in_RCX[3] = local_30;
      bVar7 = true;
      if ((long)*in_RCX * (long)in_RCX[3] - (long)in_RCX[1] * (long)in_RCX[2] != 0x40000000) {
        bVar7 = (long)*in_RCX * (long)in_RCX[3] - (long)in_RCX[1] * (long)in_RCX[2] == -0x40000000;
      }
      if (!bVar7) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
                ,0x18c,
                "test condition failed: (int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30 || (int64_t)t->u * t->r - (int64_t)t->v * t->q == -(((int64_t)1) << 30)"
               );
        abort();
      }
      *in_R8 = local_50;
      return local_4;
    }
    if ((local_34 & 1) != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
              ,0x164,"test condition failed: (f & 1) == 1");
      abort();
    }
    if ((uVar3 & 1) != 1) break;
    if (iVar4 * in_ESI + iVar5 * in_EDX != local_34 << (0x1eU - (char)local_44 & 0x1f)) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
              ,0x166,"test condition failed: (u * f0 + v * g0) == f << (30 - i)");
      abort();
    }
    if (local_2c * in_ESI + local_30 * in_EDX != uVar3 << (0x1eU - (char)local_44 & 0x1f)) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
              ,0x167,"test condition failed: (q * f0 + r * g0) == g << (30 - i)");
      abort();
    }
    local_38 = uVar3;
    local_28 = iVar5;
    local_24 = iVar4;
    if (local_4 < 0) {
      local_4 = -local_4;
      local_50 = (local_34 & uVar3) >> 1 ^ local_50;
      local_38 = local_34;
      local_24 = local_2c;
      local_28 = local_30;
      local_34 = uVar3;
      local_30 = iVar5;
      local_2c = iVar4;
    }
    local_58 = local_44;
    if (local_4 + 1 <= local_44) {
      local_58 = local_4 + 1;
    }
    if (local_58 < 1 || 0x1e < local_58) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
              ,0x178,"test condition failed: limit > 0 && limit <= 30");
      abort();
    }
    uVar2 = 0xffffffffU >> (0x20U - (char)local_58 & 0x1f) & 0xff;
    uVar1 = (short)local_38 * (ushort)secp256k1_modinv32_inv256[local_34 >> 1 & 0x7f] &
            (ushort)uVar2;
    local_38 = local_34 * uVar1 + local_38;
    local_2c = local_24 * (uint)uVar1 + local_2c;
    local_30 = local_28 * (uint)uVar1 + local_30;
    if ((local_38 & uVar2) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
              ,0x180,"test condition failed: (g & m) == 0");
      abort();
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modinv32_impl.h"
          ,0x165,"test condition failed: (g & 1) == 1");
  abort();
}

Assistant:

static int32_t secp256k1_modinv32_posdivsteps_30_var(int32_t eta, uint32_t f0, uint32_t g0, secp256k1_modinv32_trans2x2 *t, int *jacp) {
    /* Transformation matrix. */
    uint32_t u = 1, v = 0, q = 0, r = 1;
    uint32_t f = f0, g = g0, m;
    uint16_t w;
    int i = 30, limit, zeros;
    int jac = *jacp;

    for (;;) {
        /* Use a sentinel bit to count zeros only up to i. */
        zeros = secp256k1_ctz32_var(g | (UINT32_MAX << i));
        /* Perform zeros divsteps at once; they all just divide g by two. */
        g >>= zeros;
        u <<= zeros;
        v <<= zeros;
        eta -= zeros;
        i -= zeros;
        /* Update the bottom bit of jac: when dividing g by an odd power of 2,
         * if (f mod 8) is 3 or 5, the Jacobi symbol changes sign. */
        jac ^= (zeros & ((f >> 1) ^ (f >> 2)));
        /* We're done once we've done 30 posdivsteps. */
        if (i == 0) break;
        VERIFY_CHECK((f & 1) == 1);
        VERIFY_CHECK((g & 1) == 1);
        VERIFY_CHECK((u * f0 + v * g0) == f << (30 - i));
        VERIFY_CHECK((q * f0 + r * g0) == g << (30 - i));
        /* If eta is negative, negate it and replace f,g with g,f. */
        if (eta < 0) {
            uint32_t tmp;
            eta = -eta;
            /* Update bottom bit of jac: when swapping f and g, the Jacobi symbol changes sign
             * if both f and g are 3 mod 4. */
            jac ^= ((f & g) >> 1);
            tmp = f; f = g; g = tmp;
            tmp = u; u = q; q = tmp;
            tmp = v; v = r; r = tmp;
        }
        /* eta is now >= 0. In what follows we're going to cancel out the bottom bits of g. No more
         * than i can be cancelled out (as we'd be done before that point), and no more than eta+1
         * can be done as its sign will flip once that happens. */
        limit = ((int)eta + 1) > i ? i : ((int)eta + 1);
        /* m is a mask for the bottom min(limit, 8) bits (our table only supports 8 bits). */
        VERIFY_CHECK(limit > 0 && limit <= 30);
        m = (UINT32_MAX >> (32 - limit)) & 255U;
        /* Find what multiple of f must be added to g to cancel its bottom min(limit, 8) bits. */
        w = (g * secp256k1_modinv32_inv256[(f >> 1) & 127]) & m;
        /* Do so. */
        g += f * w;
        q += u * w;
        r += v * w;
        VERIFY_CHECK((g & m) == 0);
    }
    /* Return data in t and return value. */
    t->u = (int32_t)u;
    t->v = (int32_t)v;
    t->q = (int32_t)q;
    t->r = (int32_t)r;
    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2 or -2,
     * the aggregate of 30 of them will have determinant 2^30 or -2^30. */
    VERIFY_CHECK((int64_t)t->u * t->r - (int64_t)t->v * t->q == ((int64_t)1) << 30 ||
                 (int64_t)t->u * t->r - (int64_t)t->v * t->q == -(((int64_t)1) << 30));
    *jacp = jac;
    return eta;
}